

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_resolv_check(connectdata *conn,Curl_dns_entry **dns)

{
  Curl_dns_entry **dns_local;
  connectdata *conn_local;
  
  if ((*(ulong *)&(conn->data->set).field_0x8e8 >> 0x37 & 1) == 0) {
    conn_local._4_4_ = Curl_resolver_is_resolved(conn,dns);
  }
  else {
    conn_local._4_4_ = Curl_doh_is_resolved(conn,dns);
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_resolv_check(struct connectdata *conn,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)dns;
#endif

  if(conn->data->set.doh)
    return Curl_doh_is_resolved(conn, dns);
  return Curl_resolver_is_resolved(conn, dns);
}